

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# httplib.h
# Opt level: O2

bool __thiscall httplib::Server::parse_request_line(Server *this,char *s,Request *req)

{
  bool bVar1;
  int iVar2;
  size_t sVar3;
  const_iterator cVar4;
  size_t i;
  ulong uVar5;
  long lVar6;
  ulong uVar7;
  pointer b;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l;
  allocator_type local_1ac;
  less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> local_1ab;
  allocator<char> local_1aa;
  allocator<char> local_1a9;
  allocator<char> local_1a8;
  allocator<char> local_1a7;
  allocator<char> local_1a6;
  allocator<char> local_1a5;
  allocator<char> local_1a4;
  allocator<char> local_1a3;
  allocator<char> local_1a2;
  allocator<char> local_1a1;
  _Any_data local_1a0;
  code *local_190;
  code *local_188;
  _Any_data local_180;
  code *local_170;
  code *local_168;
  size_t count;
  string local_140 [32];
  string local_120 [32];
  string local_100 [32];
  string local_e0 [32];
  string local_c0 [32];
  string local_a0 [32];
  string local_80 [32];
  string local_60 [32];
  string local_40 [32];
  
  sVar3 = strlen(s);
  if (((1 < sVar3) && (s[sVar3 - 2] == '\r')) && (s[sVar3 - 1] == '\n')) {
    count = 0;
    local_168 = std::
                _Function_handler<void_(const_char_*,_const_char_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/jsonrpcx[P]json-rpc-cxx/vendor/cpp-httplib/httplib.h:4972:36)>
                ::_M_invoke;
    local_170 = std::
                _Function_handler<void_(const_char_*,_const_char_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/jsonrpcx[P]json-rpc-cxx/vendor/cpp-httplib/httplib.h:4972:36)>
                ::_M_manager;
    local_180._M_unused._M_object = &count;
    local_180._8_8_ = req;
    detail::split(s,s + (sVar3 - 2),' ',(function<void_(const_char_*,_const_char_*)> *)&local_180);
    std::_Function_base::~_Function_base((_Function_base *)&local_180);
    if (count == 3) {
      if ((parse_request_line(char_const*,httplib::Request&)::methods_abi_cxx11_ == '\0') &&
         (iVar2 = __cxa_guard_acquire(&parse_request_line(char_const*,httplib::Request&)::
                                       methods_abi_cxx11_), iVar2 != 0)) {
        std::__cxx11::string::string<std::allocator<char>>((string *)&count,"GET",&local_1a1);
        std::__cxx11::string::string<std::allocator<char>>(local_140,"HEAD",&local_1a2);
        std::__cxx11::string::string<std::allocator<char>>(local_120,"POST",&local_1a3);
        std::__cxx11::string::string<std::allocator<char>>(local_100,"PUT",&local_1a4);
        std::__cxx11::string::string<std::allocator<char>>(local_e0,"DELETE",&local_1a5);
        std::__cxx11::string::string<std::allocator<char>>(local_c0,"CONNECT",&local_1a6);
        std::__cxx11::string::string<std::allocator<char>>(local_a0,"OPTIONS",&local_1a7);
        std::__cxx11::string::string<std::allocator<char>>(local_80,"TRACE",&local_1a8);
        std::__cxx11::string::string<std::allocator<char>>(local_60,"PATCH",&local_1a9);
        std::__cxx11::string::string<std::allocator<char>>(local_40,"PRI",&local_1aa);
        __l._M_len = 10;
        __l._M_array = (iterator)&count;
        std::
        set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::set(&parse_request_line(char_const*,httplib::Request&)::methods_abi_cxx11_,__l,&local_1ab,
              &local_1ac);
        lVar6 = 0x120;
        do {
          std::__cxx11::string::~string((string *)((long)&count + lVar6));
          lVar6 = lVar6 + -0x20;
        } while (lVar6 != -0x20);
        __cxa_atexit(std::
                     set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ::~set,&parse_request_line(char_const*,httplib::Request&)::methods_abi_cxx11_,
                     &__dso_handle);
        __cxa_guard_release(&parse_request_line(char_const*,httplib::Request&)::methods_abi_cxx11_);
      }
      cVar4 = std::
              _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::find(&parse_request_line(char_const*,httplib::Request&)::methods_abi_cxx11_._M_t,
                     &req->method);
      if ((_Rb_tree_header *)cVar4._M_node !=
          &parse_request_line(char_const*,httplib::Request&)::methods_abi_cxx11_._M_t._M_impl.
           super__Rb_tree_header) {
        bVar1 = std::operator!=(&req->version,"HTTP/1.1");
        if ((!bVar1) || (bVar1 = std::operator!=(&req->version,"HTTP/1.0"), !bVar1)) {
          b = (req->target)._M_dataplus._M_p;
          uVar7 = (req->target)._M_string_length;
          uVar5 = 0;
          do {
            if (uVar7 == uVar5) {
LAB_0013566a:
              count = 0;
              local_188 = std::
                          _Function_handler<void_(const_char_*,_const_char_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/jsonrpcx[P]json-rpc-cxx/vendor/cpp-httplib/httplib.h:5005:19)>
                          ::_M_invoke;
              local_190 = std::
                          _Function_handler<void_(const_char_*,_const_char_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/jsonrpcx[P]json-rpc-cxx/vendor/cpp-httplib/httplib.h:5005:19)>
                          ::_M_manager;
              local_1a0._M_unused._M_object = &count;
              local_1a0._8_8_ = req;
              detail::split(b,b + uVar7,'?',
                            (function<void_(const_char_*,_const_char_*)> *)&local_1a0);
              std::_Function_base::~_Function_base((_Function_base *)&local_1a0);
              return count < 3;
            }
            if (b[uVar5] == '#') {
              std::__cxx11::string::erase((ulong)&req->target,uVar5);
              b = (req->target)._M_dataplus._M_p;
              uVar7 = (req->target)._M_string_length;
              goto LAB_0013566a;
            }
            uVar5 = uVar5 + 1;
          } while( true );
        }
      }
    }
  }
  return false;
}

Assistant:

inline bool Server::parse_request_line(const char *s, Request &req) {
  auto len = strlen(s);
  if (len < 2 || s[len - 2] != '\r' || s[len - 1] != '\n') { return false; }
  len -= 2;

  {
    size_t count = 0;

    detail::split(s, s + len, ' ', [&](const char *b, const char *e) {
      switch (count) {
      case 0: req.method = std::string(b, e); break;
      case 1: req.target = std::string(b, e); break;
      case 2: req.version = std::string(b, e); break;
      default: break;
      }
      count++;
    });

    if (count != 3) { return false; }
  }

  static const std::set<std::string> methods{
      "GET",     "HEAD",    "POST",  "PUT",   "DELETE",
      "CONNECT", "OPTIONS", "TRACE", "PATCH", "PRI"};

  if (methods.find(req.method) == methods.end()) { return false; }

  if (req.version != "HTTP/1.1" && req.version != "HTTP/1.0") { return false; }

  {
    // Skip URL fragment
    for (size_t i = 0; i < req.target.size(); i++) {
      if (req.target[i] == '#') {
        req.target.erase(i);
        break;
      }
    }

    size_t count = 0;

    detail::split(req.target.data(), req.target.data() + req.target.size(), '?',
                  [&](const char *b, const char *e) {
                    switch (count) {
                    case 0:
                      req.path = detail::decode_url(std::string(b, e), false);
                      break;
                    case 1: {
                      if (e - b > 0) {
                        detail::parse_query_text(std::string(b, e), req.params);
                      }
                      break;
                    }
                    default: break;
                    }
                    count++;
                  });

    if (count > 2) { return false; }
  }

  return true;
}